

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O2

int system(char *__command)

{
  __pid_t _Var1;
  __pid_t _Var2;
  char *argv [4];
  
  argv[3] = (char *)0x0;
  argv[0] = "sh";
  argv[1] = "-c";
  if (__command != (char *)0x0) {
    argv[2] = __command;
    _Var1 = fork();
    if (_Var1 == 0) {
      execve("/bin/sh",argv,(char **)0x0);
    }
    else if (0 < _Var1) {
      do {
        _Var2 = wait((void *)0x0);
      } while (_Var2 != _Var1);
    }
  }
  return -1;
}

Assistant:

int system( const char * string )
{
    const char * argv[] = { "sh", "-c", NULL, NULL };
    argv[2] = string;

    if ( string != NULL )
    {
        int pid = fork();

        if ( pid == 0 )
        {
            execve( "/bin/sh", ( char * const *)argv, NULL );
        }
        else if ( pid > 0 )
        {
            while ( wait( NULL ) != pid )
            {
                /* EMPTY */
            }
        }
    }

    return -1;
}